

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void OpenSteer::drawBasic3dSphericalVehicle(AbstractVehicle *vehicle,Color *color)

{
  long *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar1;
  undefined8 extraout_XMM0_Qb;
  undefined4 uVar2;
  float fVar3;
  Vec3 VVar4;
  Color CVar5;
  Color color5;
  Color color4;
  Color color3;
  Color color2;
  Color color1;
  float k;
  float j;
  Vec3 bottom;
  Vec3 top;
  Vec3 side2;
  Vec3 side1;
  Vec3 nose;
  Vec3 b;
  Vec3 u;
  Vec3 s;
  Vec3 f;
  Vec3 *p;
  float r;
  float y;
  float x;
  undefined4 in_stack_fffffffffffffb50;
  float fVar6;
  undefined4 uVar7;
  float s_00;
  Vec3 *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb74;
  float s_01;
  Color local_390;
  undefined8 local_380;
  undefined8 local_378;
  Color local_370;
  undefined8 local_360;
  undefined8 local_358;
  Color local_350;
  undefined8 local_340;
  undefined8 local_338;
  Color local_330;
  undefined8 local_320;
  undefined8 local_318;
  Color local_310;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined4 local_2ec;
  Vec3 local_2e8;
  Vec3 local_2d8;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2b8;
  float local_2b0;
  Vec3 local_2a8;
  Vec3 local_298;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  Vec3 local_268;
  Vec3 local_258;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  Vec3 local_228;
  Vec3 local_218;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  Vec3 local_1e8;
  undefined8 local_1d8;
  float local_1d0;
  Vec3 local_1c8;
  Vec3 local_1b8;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  undefined8 local_178;
  float local_170;
  Vec3 local_168;
  undefined8 local_158;
  float local_150;
  undefined8 local_148;
  float local_140;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  Vec3 local_e8;
  Vec3 local_d8;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  Vec3 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  undefined8 local_38 [2];
  undefined8 *local_28;
  float local_1c;
  float local_18;
  undefined4 local_14;
  long *local_8;
  
  local_14 = 0x3f000000;
  local_8 = in_RDI;
  local_18 = sqrtXXX(0.0);
  local_1c = (float)(**(code **)(*local_8 + 0xc0))();
  local_48 = (**(code **)(*local_8 + 0x40))();
  local_28 = local_38;
  fVar6 = local_1c;
  local_38[0] = local_48;
  (**(code **)(*local_8 + 0x30))();
  uVar1 = (undefined4)extraout_XMM0_Qb;
  uVar2 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
  local_78 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  uVar7 = extraout_XMM0_Da;
  s_00 = extraout_XMM0_Db;
  local_68 = local_78;
  VVar4 = operator*(in_stack_fffffffffffffb74,in_stack_fffffffffffffb68);
  fVar3 = VVar4.z;
  local_88._0_8_ = VVar4._0_8_;
  local_58._0_4_ = local_88.x;
  local_58._4_4_ = local_88.y;
  s_01 = local_1c;
  local_88 = VVar4;
  local_50 = fVar3;
  (**(code **)(*local_8 + 0x10))();
  local_c8 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  local_c0 = fVar3;
  local_b8 = local_c8;
  local_b0 = fVar3;
  VVar4 = operator*(s_01,in_stack_fffffffffffffb68);
  local_d8.z = VVar4.z;
  local_a0 = local_d8.z;
  local_d8._0_8_ = VVar4._0_8_;
  local_a8._0_4_ = local_d8.x;
  local_a8._4_4_ = local_d8.y;
  local_d8 = VVar4;
  VVar4 = Vec3::operator*((Vec3 *)CONCAT44(uVar2,uVar1),s_00);
  fVar3 = VVar4.z;
  local_e8._0_8_ = VVar4._0_8_;
  local_98._0_4_ = local_e8.x;
  local_98._4_4_ = local_e8.y;
  local_e8 = VVar4;
  local_90 = fVar3;
  (**(code **)(*local_8 + 0x20))();
  local_138 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  local_130 = fVar3;
  local_128 = local_138;
  local_120 = fVar3;
  VVar4 = operator*(s_01,in_stack_fffffffffffffb68);
  local_140 = VVar4.z;
  local_148 = VVar4._0_8_;
  local_118 = local_148;
  local_110 = local_140;
  VVar4 = Vec3::operator*((Vec3 *)CONCAT44(uVar2,uVar1),s_00);
  local_150 = VVar4.z;
  local_158 = VVar4._0_8_;
  local_108 = local_158;
  local_100 = local_150;
  VVar4 = Vec3::operator*((Vec3 *)CONCAT44(uVar2,uVar1),s_00);
  fVar3 = VVar4.z;
  local_168._0_8_ = VVar4._0_8_;
  local_f8._0_4_ = local_168.x;
  local_f8._4_4_ = local_168.y;
  local_168 = VVar4;
  local_f0 = fVar3;
  (**(code **)(*local_8 + 0x30))();
  local_1a8 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
  local_1a0 = fVar3;
  local_198 = local_1a8;
  local_190 = fVar3;
  VVar4 = operator*(s_01,in_stack_fffffffffffffb68);
  local_1b8.z = VVar4.z;
  local_180 = local_1b8.z;
  local_1b8._0_8_ = VVar4._0_8_;
  local_188._0_4_ = local_1b8.x;
  local_188._4_4_ = local_1b8.y;
  local_1b8 = VVar4;
  VVar4 = Vec3::operator*((Vec3 *)CONCAT44(uVar2,uVar1),s_00);
  local_1c8.z = VVar4.z;
  local_170 = local_1c8.z;
  local_1c8._0_8_ = VVar4._0_8_;
  local_178._0_4_ = local_1c8.x;
  local_178._4_4_ = local_1c8.y;
  local_1c8 = VVar4;
  VVar4 = Vec3::operator+((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_1e8.z = VVar4.z;
  local_1d0 = local_1e8.z;
  local_1e8._0_8_ = VVar4._0_8_;
  local_1d8._0_4_ = local_1e8.x;
  local_1d8._4_4_ = local_1e8.y;
  local_1e8 = VVar4;
  VVar4 = Vec3::operator+((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_218.z = VVar4.z;
  local_200 = local_218.z;
  local_218._0_8_ = VVar4._0_8_;
  local_208._0_4_ = local_218.x;
  local_208._4_4_ = local_218.y;
  local_218 = VVar4;
  VVar4 = Vec3::operator-((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_228.z = VVar4.z;
  local_1f0 = local_228.z;
  local_228._0_8_ = VVar4._0_8_;
  local_1f8._0_4_ = local_228.x;
  local_1f8._4_4_ = local_228.y;
  local_228 = VVar4;
  VVar4 = Vec3::operator+((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_258.z = VVar4.z;
  local_240 = local_258.z;
  local_258._0_8_ = VVar4._0_8_;
  local_248._0_4_ = local_258.x;
  local_248._4_4_ = local_258.y;
  local_258 = VVar4;
  VVar4 = Vec3::operator+((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_268.z = VVar4.z;
  local_230 = local_268.z;
  local_268._0_8_ = VVar4._0_8_;
  local_238._0_4_ = local_268.x;
  local_238._4_4_ = local_268.y;
  local_268 = VVar4;
  VVar4 = Vec3::operator+((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_298.z = VVar4.z;
  local_280 = local_298.z;
  local_298._0_8_ = VVar4._0_8_;
  local_288._0_4_ = local_298.x;
  local_288._4_4_ = local_298.y;
  local_298 = VVar4;
  VVar4 = Vec3::operator+((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_2a8.z = VVar4.z;
  local_270 = local_2a8.z;
  local_2a8._0_8_ = VVar4._0_8_;
  local_278._0_4_ = local_2a8.x;
  local_278._4_4_ = local_2a8.y;
  local_2a8 = VVar4;
  VVar4 = Vec3::operator+((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_2d8.z = VVar4.z;
  local_2c0 = local_2d8.z;
  local_2d8._0_8_ = VVar4._0_8_;
  local_2c8._0_4_ = local_2d8.x;
  local_2c8._4_4_ = local_2d8.y;
  local_2d8 = VVar4;
  VVar4 = Vec3::operator-((Vec3 *)CONCAT44(uVar2,uVar1),(Vec3 *)CONCAT44(s_00,uVar7));
  local_2e8.z = VVar4.z;
  local_2b0 = local_2e8.z;
  local_2e8._0_8_ = VVar4._0_8_;
  local_2b8._0_4_ = local_2e8.x;
  local_2b8._4_4_ = local_2e8.y;
  local_2ec = 0x3d4ccccd;
  local_2f0 = 0xbd4ccccd;
  local_2e8 = VVar4;
  Color::Color(&local_310,0.05,0.05,-0.05,1.0);
  CVar5 = operator+((Color *)CONCAT44(s_00,uVar7),(Color *)CONCAT44(fVar6,in_stack_fffffffffffffb50)
                   );
  local_2f8 = CVar5._8_8_;
  local_300 = CVar5._0_8_;
  Color::Color(&local_330,0.05,-0.05,0.05,1.0);
  CVar5 = operator+((Color *)CONCAT44(s_00,uVar7),(Color *)CONCAT44(fVar6,in_stack_fffffffffffffb50)
                   );
  local_320 = CVar5._0_8_;
  local_318 = CVar5._8_8_;
  Color::Color(&local_350,-0.05,0.05,0.05,1.0);
  CVar5 = operator+((Color *)CONCAT44(s_00,uVar7),(Color *)CONCAT44(fVar6,in_stack_fffffffffffffb50)
                   );
  local_338 = CVar5._8_8_;
  local_340 = CVar5._0_8_;
  Color::Color(&local_370,-0.05,0.05,-0.05,1.0);
  CVar5 = operator+((Color *)CONCAT44(s_00,uVar7),(Color *)CONCAT44(fVar6,in_stack_fffffffffffffb50)
                   );
  local_358 = CVar5._8_8_;
  local_360 = CVar5._0_8_;
  Color::Color(&local_390,-0.05,-0.05,0.05,1.0);
  CVar5 = operator+((Color *)CONCAT44(s_00,uVar7),(Color *)CONCAT44(fVar6,in_stack_fffffffffffffb50)
                   );
  local_380 = CVar5._0_8_;
  local_378 = CVar5._8_8_;
  anon_unknown.dwarf_1485b::iDrawTriangle
            ((Vec3 *)CONCAT44(s_01,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68,
             (Vec3 *)CONCAT44(uVar2,uVar1),(Color *)CONCAT44(s_00,uVar7));
  anon_unknown.dwarf_1485b::iDrawTriangle
            ((Vec3 *)CONCAT44(s_01,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68,
             (Vec3 *)CONCAT44(uVar2,uVar1),(Color *)CONCAT44(s_00,uVar7));
  anon_unknown.dwarf_1485b::iDrawTriangle
            ((Vec3 *)CONCAT44(s_01,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68,
             (Vec3 *)CONCAT44(uVar2,uVar1),(Color *)CONCAT44(s_00,uVar7));
  anon_unknown.dwarf_1485b::iDrawTriangle
            ((Vec3 *)CONCAT44(s_01,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68,
             (Vec3 *)CONCAT44(uVar2,uVar1),(Color *)CONCAT44(s_00,uVar7));
  anon_unknown.dwarf_1485b::iDrawTriangle
            ((Vec3 *)CONCAT44(s_01,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68,
             (Vec3 *)CONCAT44(uVar2,uVar1),(Color *)CONCAT44(s_00,uVar7));
  anon_unknown.dwarf_1485b::iDrawTriangle
            ((Vec3 *)CONCAT44(s_01,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68,
             (Vec3 *)CONCAT44(uVar2,uVar1),(Color *)CONCAT44(s_00,uVar7));
  return;
}

Assistant:

void 
OpenSteer::drawBasic3dSphericalVehicle (const AbstractVehicle* vehicle,
                                        const Color& color)
{
    // "aspect ratio" of body (as seen from above)
    const float x = 0.5f;
    const float y = sqrtXXX (1 - (x * x));

    // radius and position of vehicle
    const float r = vehicle->radius();
    const Vec3& p = vehicle->position();

    // body shape parameters
    const Vec3 f = r * vehicle->forward();
    const Vec3 s = r * vehicle->side() * x;
    const Vec3 u = r * vehicle->up() * x * 0.5f;
    const Vec3 b = r * vehicle->forward() * -y;

    // vertex positions
    const Vec3 nose   = p + f;
    const Vec3 side1  = p + b - s;
    const Vec3 side2  = p + b + s;
    const Vec3 top    = p + b + u;
    const Vec3 bottom = p + b - u;

    // colors
    const float j = +0.05f;
    const float k = -0.05f;
    const Color color1 = color + Color(j, j, k);
    const Color color2 = color + Color(j, k, j);
    const Color color3 = color + Color(k, j, j);
    const Color color4 = color + Color(k, j, k);
    const Color color5 = color + Color(k, k, j);

    // draw body
    iDrawTriangle (nose,  side1,  top,    color1);  // top, side 1
    iDrawTriangle (nose,  top,    side2,  color2);  // top, side 2
    iDrawTriangle (nose,  bottom, side1,  color3);  // bottom, side 1
    iDrawTriangle (nose,  side2,  bottom, color4);  // bottom, side 2
    iDrawTriangle (side1, side2,  top,    color5);  // top back
    iDrawTriangle (side2, side1,  bottom, color5);  // bottom back
}